

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O3

void __thiscall
QStyledItemDelegate::paint
          (QStyledItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,
          QModelIndex *index)

{
  QWidget *this_00;
  QStyle *pQVar1;
  long in_FS_OFFSET;
  QStyleOptionViewItem opt;
  QStyleOptionViewItem local_100;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_100,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_100,option);
  (**(code **)(*(long *)this + 0xb8))(this,&local_100,index);
  this_00 = option->widget;
  if (this_00 == (QWidget *)0x0) {
    pQVar1 = QApplication::style();
  }
  else {
    pQVar1 = QWidget::style(this_00);
  }
  (**(code **)(*(long *)pQVar1 + 0xb8))(pQVar1,0x2d,&local_100,painter,this_00);
  QBrush::~QBrush(&local_100.backgroundBrush);
  if (&(local_100.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_100.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_100.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_100.icon);
  QLocale::~QLocale(&local_100.locale);
  QFont::~QFont(&local_100.font);
  QStyleOption::~QStyleOption(&local_100.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyledItemDelegate::paint(QPainter *painter,
        const QStyleOptionViewItem &option, const QModelIndex &index) const
{
    Q_ASSERT(index.isValid());

    QStyleOptionViewItem opt = option;
    initStyleOption(&opt, index);

    const QWidget *widget = QStyledItemDelegatePrivate::widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    style->drawControl(QStyle::CE_ItemViewItem, &opt, painter, widget);
}